

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

void __thiscall Js::CompoundString::Builder<256U>::SwitchToPointerMode(Builder<256U> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x1e1,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->directCharLength = this->charLength;
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
  if (bVar2) {
    Output::Print(L"CompoundString::SwitchToPointerMode() - directCharLength = %u\n",
                  (ulong)this->directCharLength);
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void CompoundString::Builder<MinimumCharCapacity>::SwitchToPointerMode()
    {
        Assert(HasOnlyDirectChars());

        directCharLength = charLength;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(_u("CompoundString::SwitchToPointerMode() - directCharLength = %u\n"), directCharLength);
            Output::Flush();
        }
    }